

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# equalizer.c
# Opt level: O0

void fft_equalize(fft_window_data *data,void *user)

{
  ulong uVar1;
  float *pfVar2;
  float fVar3;
  uint uVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  undefined1 auVar8 [64];
  undefined1 auVar9 [16];
  float pha;
  float mag;
  uint32_t i_2;
  float v;
  int p3;
  int p0;
  int p1;
  int p2;
  int i_1;
  uint32_t p;
  float im;
  float re;
  uint32_t i;
  float *bands;
  float *fft_workspace;
  uint32_t framesize;
  equalizer_segment_data *user_data;
  void *user_local;
  fft_window_data *data_local;
  undefined1 extraout_var [56];
  
  uVar1 = data->framesize;
  fVar3 = (float)uVar1;
  pfVar2 = data->fft_workspace;
  for (im = 0.0; (uint)im < (uint)fVar3; im = (float)((int)im + 2)) {
    fVar6 = pfVar2[(uint)im];
    fVar7 = pfVar2[(int)im + 1];
    fVar5 = sqrtf(fVar6 * fVar6 + fVar7 * fVar7);
    pfVar2[(uint)im] = fVar5 * 2.0;
    fVar6 = atan2f(fVar7,fVar6);
    pfVar2[(int)im + 1] = fVar6;
  }
  for (p2 = 0; (uint)p2 < (uint)fVar3; p2 = p2 + 2) {
    auVar8._0_8_ = sqrt((double)((float)(uint)p2 / (float)(uVar1 & 0xffffffff)));
    auVar8._8_56_ = extraout_var;
    auVar9._8_8_ = 0;
    auVar9._0_8_ = auVar8._0_8_ * (double)((uint)fVar3 >> 1);
    auVar9 = vroundsd_avx(auVar8._0_16_,auVar9,9);
    uVar4 = (uint)(int)auVar9._0_8_ / ((uint)fVar3 >> 4);
    p3 = uVar4 - 1;
    v = (float)(uVar4 - 2);
    i_2 = uVar4 + 1;
    if (p3 < 0) {
      p3 = 0;
    }
    if ((int)v < 0) {
      v = 0.0;
    }
    if (7 < (int)i_2) {
      i_2 = 7;
    }
    fVar6 = catmullrom((float)((uint)(int)auVar9._0_8_ % ((uint)fVar3 >> 4)) /
                       (float)((uint)fVar3 >> 4),*(float *)((long)user + (long)(int)v * 4 + 0x68),
                       *(float *)((long)user + (long)p3 * 4 + 0x68),
                       *(float *)((long)user + (long)(int)uVar4 * 4 + 0x68),
                       *(float *)((long)user + (long)(int)i_2 * 4 + 0x68));
    pfVar2[(uint)p2] = fVar6 * pfVar2[(uint)p2];
  }
  for (pha = 0.0; (uint)pha < (uint)fVar3; pha = (float)((int)pha + 2)) {
    fVar6 = pfVar2[(uint)pha];
    fVar7 = pfVar2[(int)pha + 1];
    fVar5 = cosf(fVar7);
    pfVar2[(uint)pha] = fVar5 * fVar6;
    fVar7 = sinf(fVar7);
    pfVar2[(int)pha + 1] = fVar7 * fVar6;
  }
  return;
}

Assistant:

VECTORIZE void fft_equalize(struct fft_window_data *data, void *user){
  struct equalizer_segment_data *user_data = (struct equalizer_segment_data *)user;
  uint32_t framesize = data->framesize;
  float *fft_workspace = data->fft_workspace;
  float *bands = user_data->bands;

  // Change to mag/phase
  for(uint32_t i = 0; i < framesize; i+= 2){
    float re = fft_workspace[i+0];
    float im = fft_workspace[i+1];
    fft_workspace[i+0] = sqrtf(re * re + im * im) * 2;
    fft_workspace[i+1] = atan2f(im, re);
  }

  // Perform band eq
  for(uint32_t p = 0; p < framesize; p+= 2){
    int i = (int)floor(sqrt(p / (float)(framesize)) * (framesize / 2));
	int p2 = (i / (framesize / 16));
	int p1 = p2 - 1;
	int p0 = p1 - 1;
	int p3 = p2 + 1;
	if (p1 < 0) p1 = 0;
	if (p0 < 0) p0 = 0;
	if (p3 > 7) p3 = 7;
	float v = (float)(i % (framesize / 16)) / (float)(framesize / 16);
	fft_workspace[p] *= catmullrom(v, bands[p0], bands[p1], bands[p2], bands[p3]);
  }

  // Change back to complex
  for(uint32_t i = 0; i < framesize; i+= 2){
	float mag = fft_workspace[i+0];
	float pha = fft_workspace[i+1];
	fft_workspace[i+0] = cosf(pha) * mag;
	fft_workspace[i+1] = sinf(pha) * mag;
  }
}